

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GetNameTest.cpp
# Opt level: O0

void __thiscall GetNameTest::SubmitPacket(GetNameTest *this,uint8_t *packet,uint32_t length)

{
  bool bVar1;
  uint local_15c;
  uint local_158;
  uint32_t i_3;
  uint32_t i_2;
  uint32_t i_1;
  uint32_t i;
  uint32_t flags;
  char text [256];
  uint local_3c;
  uint uStack_38;
  bool gotTld;
  int nb_name_parts;
  uint32_t previous_offset;
  uint32_t tld_offset;
  uint32_t parse_index;
  uint32_t arcount;
  uint32_t nscount;
  uint32_t ancount;
  uint32_t qdcount;
  uint32_t length_local;
  uint8_t *packet_local;
  GetNameTest *this_local;
  
  nscount = 0;
  arcount = 0;
  parse_index = 0;
  tld_offset = 0;
  previous_offset = 0xc;
  nb_name_parts = 0;
  uStack_38 = 0;
  local_3c = 0;
  ancount = length;
  _qdcount = packet;
  packet_local = (uint8_t *)this;
  bVar1 = DnsStats::GetTLD(packet,length,0xc,(uint32_t *)&nb_name_parts,&stack0xffffffffffffffc8,
                           (int *)&local_3c);
  nscount = (uint32_t)CONCAT11(_qdcount[4],_qdcount[5]);
  arcount = (uint32_t)CONCAT11(_qdcount[6],_qdcount[7]);
  parse_index = (uint32_t)CONCAT11(_qdcount[8],_qdcount[9]);
  tld_offset = (uint32_t)CONCAT11(_qdcount[10],_qdcount[0xb]);
  if (bVar1) {
    if (uStack_38 != 0) {
      DnsStats::NormalizeNamePart
                ((uint)_qdcount[uStack_38],_qdcount + (uStack_38 + 1),(uint8_t *)&i,0x100,&i_1);
      fprintf((FILE *)this->test_out,"%s.",&i);
    }
    DnsStats::NormalizeNamePart
              ((uint)_qdcount[(uint)nb_name_parts],_qdcount + (nb_name_parts + 1),(uint8_t *)&i,
               0x100,&i_1);
    fprintf((FILE *)this->test_out,"%s",&i);
    fprintf((FILE *)this->test_out," %d\n",(ulong)local_3c);
  }
  else {
    fprintf((FILE *)this->test_out,"??? %d\n",(ulong)local_3c);
  }
  i_2 = 0;
  while ((i_2 < nscount && (previous_offset < ancount))) {
    previous_offset = SubmitQuery(this,_qdcount,ancount,previous_offset);
    i_2 = i_2 + 1;
  }
  i_3 = 0;
  while ((i_3 < arcount && (previous_offset < ancount))) {
    previous_offset = SubmitRecord(this,_qdcount,ancount,previous_offset);
    i_3 = i_3 + 1;
  }
  local_158 = 0;
  while ((local_158 < parse_index && (previous_offset < ancount))) {
    previous_offset = SubmitRecord(this,_qdcount,ancount,previous_offset);
    local_158 = local_158 + 1;
  }
  local_15c = 0;
  while ((local_15c < tld_offset && (previous_offset < ancount))) {
    previous_offset = SubmitRecord(this,_qdcount,ancount,previous_offset);
    local_15c = local_15c + 1;
  }
  return;
}

Assistant:

void GetNameTest::SubmitPacket(uint8_t * packet, uint32_t length)
{
    uint32_t qdcount = 0;
    uint32_t ancount = 0;
    uint32_t nscount = 0;
    uint32_t arcount = 0;
    uint32_t parse_index = 12;
    uint32_t tld_offset = 0;
    uint32_t previous_offset = 0;
    int nb_name_parts = 0;
    bool gotTld = DnsStats::GetTLD(packet, length, 12, &tld_offset, &previous_offset, &nb_name_parts);

    qdcount = (packet[4] << 8) | packet[5];
    ancount = (packet[6] << 8) | packet[7];
    nscount = (packet[8] << 8) | packet[9];
    arcount = (packet[10] << 8) | packet[11];

    if (gotTld) {
        char text[256];
        uint32_t flags;

        if (previous_offset != 0) {
            (void) DnsStats::NormalizeNamePart(packet[previous_offset],
                &packet[previous_offset + 1], (uint8_t *)text, sizeof(text), &flags);
            fprintf(test_out, "%s.", text);
        }
        (void) DnsStats::NormalizeNamePart(packet[tld_offset],
            &packet[tld_offset + 1], (uint8_t *)text, sizeof(text), &flags);
        fprintf(test_out, "%s", text);

        fprintf(test_out, " %d\n", nb_name_parts);
    }
    else {
        fprintf(test_out, "??? %d\n", nb_name_parts);
    }

    for (uint32_t i = 0; i < qdcount; i++)
    {
        if (parse_index >= length)
        {
            break;
        }
        else
        {
            parse_index = SubmitQuery(packet, length, parse_index);
        }
    }

    for (uint32_t i = 0; i < ancount; i++)
    {
        if (parse_index >= length)
        {
            break;
        }
        else
        {
            parse_index = SubmitRecord(packet, length, parse_index);
        }
    }

    for (uint32_t i = 0; i < nscount; i++)
    {
        if (parse_index >= length)
        {
            break;
        }
        else
        {
            parse_index = SubmitRecord(packet, length, parse_index);
        }
    }

    for (uint32_t i = 0; i < arcount; i++)
    {
        if (parse_index >= length)
        {
            break;
        }
        else
        {
            parse_index = SubmitRecord(packet, length, parse_index);
        }
    }
}